

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::DisjunctionPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec7f2f;
      *puVar4 = 0;
    }
    EVar1 = *this->next;
    if ((ushort)EVar1 < 0x29) {
      if (EVar1 == L'\0') {
        if (this->next < this->inputLim) goto LAB_00ec7dc6;
        break;
      }
    }
    else {
      if (EVar1 == L')') break;
LAB_00ec7dc6:
      if ((EVar1 == L'/') || (EVar1 == L'|')) break;
    }
    TermPass0(this,depth);
  } while( true );
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00ec7dfd:
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) {
LAB_00ec7f2f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (*this->next != L'|') {
    return;
  }
  if (this->inputLim < this->next + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec7f2f;
    *puVar4 = 0;
  }
  this->next = this->next + 1;
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec7f2f;
      *puVar4 = 0;
    }
    EVar1 = *this->next;
    if ((ushort)EVar1 < 0x29) {
      if (EVar1 == L'\0') {
        if (this->next < this->inputLim) goto LAB_00ec7eff;
        goto LAB_00ec7dfd;
      }
    }
    else {
      if (EVar1 == L')') goto LAB_00ec7dfd;
LAB_00ec7eff:
      if ((EVar1 == L'/') || (EVar1 == L'|')) goto LAB_00ec7dfd;
    }
    TermPass0(this,depth);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::DisjunctionPass0(int depth)
    {
        AlternativePass0(depth);
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return;
            ECConsume();
            AlternativePass0(depth);
        }
    }